

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<kj::OwnFd>::destroy(ImmediatePromiseNode<kj::OwnFd> *this)

{
  if ((this->result).value.ptr.isSet == true) {
    OwnFd::~OwnFd(&(this->result).value.ptr.field_1.value);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }